

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O1

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::find_last_not_of(StringPiece *this,StringPiece s,size_type pos)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  long lVar4;
  ulong uVar5;
  size_type sVar6;
  stringpiece_ssize_type i;
  long lVar7;
  char *data;
  stringpiece_ssize_type length;
  bool lookup [256];
  char acStack_128 [256];
  
  lVar4 = s.length_;
  sVar2 = 0xffffffffffffffff;
  sVar3 = sVar2;
  if (0 < this->length_) {
    uVar5 = this->length_ - 1;
    sVar6 = pos;
    if (uVar5 < pos) {
      sVar6 = uVar5;
    }
    sVar3 = sVar6;
    if (0 < lVar4) {
      if (lVar4 == 1) {
        if (uVar5 < pos) {
          pos = uVar5;
        }
        sVar3 = sVar2;
        if (-1 < (long)pos) {
          do {
            if (this->ptr_[pos] != *s.ptr_) {
              return pos;
            }
            bVar1 = 0 < (long)pos;
            pos = pos - 1;
          } while (bVar1);
        }
      }
      else {
        lVar7 = 0;
        memset(acStack_128,0,0x100);
        do {
          acStack_128[(byte)s.ptr_[lVar7]] = '\x01';
          lVar7 = lVar7 + 1;
        } while (lVar4 != lVar7);
        sVar3 = 0xffffffffffffffff;
        if (-1 < (long)sVar6) {
          do {
            if (acStack_128[(byte)this->ptr_[sVar6]] != '\x01') {
              return sVar6;
            }
            bVar1 = 0 < (long)sVar6;
            sVar6 = sVar6 - 1;
          } while (bVar1);
        }
      }
    }
  }
  return sVar3;
}

Assistant:

stringpiece_ssize_type StringPiece::find_last_not_of(StringPiece s,
                                                     size_type pos) const {
  if (length_ <= 0) return npos;

  stringpiece_ssize_type i = std::min(pos, static_cast<size_type>(length_ - 1));
  if (s.length_ <= 0) return i;

  // Avoid the cost of BuildLookupTable() for a single-character search.
  if (s.length_ == 1) return find_last_not_of(s.ptr_[0], pos);

  bool lookup[UCHAR_MAX + 1] = { false };
  BuildLookupTable(s, lookup);
  for (; i >= 0; --i) {
    if (!lookup[static_cast<unsigned char>(ptr_[i])]) {
      return i;
    }
  }
  return npos;
}